

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::LoopExpr::LoopExpr
          (LoopExpr *this,Lexer *lexer,ExprType type,Position *pos,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *initExpr,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *condExpr,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *itExpr,
          unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *bodyExpr)

{
  bool bVar1;
  pointer this_00;
  byte local_41;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *condExpr_local;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *initExpr_local;
  Position *pos_local;
  ExprType type_local;
  Lexer *lexer_local;
  LoopExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,type,pos);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__LoopExpr_00176948;
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr
            (&this->initExpr,initExpr);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr
            (&this->condExpr,condExpr);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr
            (&this->itExpr,itExpr);
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::unique_ptr
            (&this->bodyExpr,bodyExpr);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->condExpr);
  if (!bVar1) {
    __assert_fail("this->condExpr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x29e,
                  "pfederc::LoopExpr::LoopExpr(const Lexer &, ExprType, const Position &, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&, std::unique_ptr<BodyExpr> &&)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->initExpr);
  if (bVar1) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->itExpr);
    local_41 = 1;
    if (bVar1) goto LAB_00148fb3;
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->initExpr);
  local_41 = bVar1 ^ 0xff;
LAB_00148fb3:
  if ((local_41 & 1) == 0) {
    __assert_fail("(!!this->initExpr && !!this->itExpr) || !this->initExpr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x29f,
                  "pfederc::LoopExpr::LoopExpr(const Lexer &, ExprType, const Position &, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&, std::unique_ptr<BodyExpr> &&)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->bodyExpr);
  if (bVar1) {
    _setParent<pfederc::Expr>(&this->initExpr,&this->super_Expr);
    this_00 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                        (&this->condExpr);
    Expr::setParent(this_00,&this->super_Expr);
    _setParent<pfederc::Expr>(&this->itExpr,&this->super_Expr);
    _setParent<pfederc::BodyExpr>(&this->bodyExpr,&this->super_Expr);
    return;
  }
  __assert_fail("!!this->bodyExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x2a0,
                "pfederc::LoopExpr::LoopExpr(const Lexer &, ExprType, const Position &, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&, std::unique_ptr<BodyExpr> &&)"
               );
}

Assistant:

LoopExpr::LoopExpr(const Lexer &lexer, ExprType type, const Position &pos,
    std::unique_ptr<Expr> &&initExpr,
    std::unique_ptr<Expr> &&condExpr,
    std::unique_ptr<Expr> &&itExpr,
    std::unique_ptr<BodyExpr> &&bodyExpr) noexcept
    : Expr(lexer, type, pos), initExpr(std::move(initExpr)),
      condExpr(std::move(condExpr)), itExpr(std::move(itExpr)),
      bodyExpr(std::move(bodyExpr)) {
  assert(this->condExpr);
  assert((!!this->initExpr && !!this->itExpr) || !this->initExpr);
  assert(!!this->bodyExpr);

  _setParent(this->initExpr, this);
  this->condExpr->setParent(this);
  _setParent(this->itExpr, this);

  _setParent(this->bodyExpr, this);
}